

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_adynarray.c
# Opt level: O2

void test_ADynArray_setRange_success_indexAndRangeBeyondSize_fn(int _i)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  char *expr;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  char c;
  code *local_38;
  code *pcStack_30;
  code *local_28;
  char *local_20;
  char *local_18;
  char *local_10;
  
  local_38 = private_ACUtilsTest_ADynArray_realloc;
  pcStack_30 = private_ACUtilsTest_ADynArray_free;
  local_20 = (char *)0x3;
  local_28 = private_ACUtilsTest_ADynArray_growStrategy;
  local_18 = (char *)0x10;
  private_ACUtilsTest_ADynArray_reallocFail = 0;
  local_10 = (char *)private_ACUtilsTest_ADynArray_realloc((void *)0x0,0x10);
  private_ACUtilsTest_ADynArray_reallocFailCounter = 0;
  local_10[0] = '0';
  local_10[1] = '1';
  private_ACUtilsTest_ADynArray_reallocCount = 0;
  local_10[2] = '2';
  private_ACUtilsTest_ADynArray_reallocFail = 1;
  c = '3';
  bVar1 = private_ACUtils_ADynArray_setRange(&local_38,3,2,&c,1);
  if (bVar1 == true) {
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                ,0x724);
    if (local_20 == (char *)0x5) {
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                  ,0x725);
      if (local_18 == (char *)0x10) {
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,0x726);
        if (local_10 == (char *)0x0) {
          pcVar3 = (char *)0x0;
          pcVar7 = (char *)0x0;
          expr = "Assertion \'_ck_x != NULL\' failed";
          pcVar4 = "Assertion \'%s\' failed: %s == %#x";
          pcVar5 = "(void*) array.buffer != NULL";
          pcVar6 = "(void*) array.buffer";
          iVar2 = 0x727;
        }
        else {
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                      ,0x727);
          if (local_28 == (code *)0x0) {
            pcVar3 = (char *)0x0;
            pcVar7 = (char *)0x0;
            expr = "Assertion \'_ck_x != NULL\' failed";
            pcVar4 = "Assertion \'%s\' failed: %s == %#x";
            pcVar5 = "(void*) array.growStrategy != NULL";
            pcVar6 = "(void*) array.growStrategy";
            iVar2 = 0x728;
          }
          else {
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                        ,0x728);
            pcVar7 = local_10;
            local_10[(long)local_20] = '\0';
            if (local_10 == (char *)0x0) {
              pcVar3 = "";
              pcVar7 = "(null)";
            }
            else {
              iVar2 = strcmp("01233",local_10);
              if (iVar2 == 0) {
                _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                            ,0x72a);
                if (private_ACUtilsTest_ADynArray_reallocCount == 0) {
                  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                              ,0x72b);
                  c = '6';
                  bVar1 = private_ACUtils_ADynArray_setRange(&local_38,0x926,3,&c,1);
                  if (bVar1 == true) {
                    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                                ,0x72d);
                    if (local_20 == (char *)0x8) {
                      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                                  ,0x72e);
                      if (local_18 == (char *)0x10) {
                        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                                    ,0x72f);
                        if (local_10 == (char *)0x0) {
                          pcVar7 = (char *)0x0;
                          expr = "Assertion \'_ck_x != NULL\' failed";
                          pcVar4 = "Assertion \'%s\' failed: %s == %#x";
                          pcVar5 = "(void*) array.buffer != NULL";
                          pcVar6 = "(void*) array.buffer";
                          iVar2 = 0x730;
                          pcVar3 = (char *)0x0;
                        }
                        else {
                          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                                      ,0x730);
                          if (local_28 == (code *)0x0) {
                            pcVar7 = (char *)0x0;
                            expr = "Assertion \'_ck_x != NULL\' failed";
                            pcVar4 = "Assertion \'%s\' failed: %s == %#x";
                            pcVar5 = "(void*) array.growStrategy != NULL";
                            pcVar6 = "(void*) array.growStrategy";
                            iVar2 = 0x731;
                            pcVar3 = (char *)0x0;
                          }
                          else {
                            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                                        ,0x731);
                            pcVar7 = local_10;
                            local_10[(long)local_20] = '\0';
                            if (local_10 == (char *)0x0) {
                              pcVar7 = "(null)";
                              pcVar3 = "";
                            }
                            else {
                              iVar2 = strcmp("01233666",local_10);
                              if (iVar2 == 0) {
                                _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                                            ,0x733);
                                if (private_ACUtilsTest_ADynArray_reallocCount == 0) {
                                  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                                              ,0x734);
                                  (*pcStack_30)(local_10);
                                  return;
                                }
                                pcVar7 = "0";
                                expr = "Assertion \'_ck_x == _ck_y\' failed";
                                pcVar4 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
                                pcVar5 = "private_ACUtilsTest_ADynArray_reallocCount == 0";
                                pcVar6 = "private_ACUtilsTest_ADynArray_reallocCount";
                                iVar2 = 0x734;
                                pcVar3 = (char *)private_ACUtilsTest_ADynArray_reallocCount;
                                goto LAB_0011a866;
                              }
                              pcVar3 = "\"";
                            }
                            expr = 
                            "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
                            ;
                            pcVar4 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
                            pcVar5 = "array.buffer == \"01233666\"";
                            pcVar6 = "array.buffer";
                            iVar2 = 0x733;
                          }
                        }
                      }
                      else {
                        pcVar7 = "16";
                        expr = "Assertion \'_ck_x == _ck_y\' failed";
                        pcVar4 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
                        pcVar5 = "array.capacity == 16";
                        pcVar6 = "array.capacity";
                        iVar2 = 0x72f;
                        pcVar3 = local_18;
                      }
                    }
                    else {
                      pcVar7 = "8";
                      expr = "Assertion \'_ck_x == _ck_y\' failed";
                      pcVar4 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
                      pcVar5 = "array.size == 8";
                      pcVar6 = "array.size";
                      iVar2 = 0x72e;
                      pcVar3 = local_20;
                    }
                  }
                  else {
                    pcVar7 = "true";
                    expr = "Assertion \'_ck_x == _ck_y\' failed";
                    pcVar4 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
                    pcVar5 = 
                    "private_ACUtils_ADynArray_setRange(&array, 2342, 3, &(c), sizeof(*(&array)->buffer)) == true"
                    ;
                    pcVar6 = 
                    "private_ACUtils_ADynArray_setRange(&array, 2342, 3, &(c), sizeof(*(&array)->buffer))"
                    ;
                    iVar2 = 0x72d;
                    pcVar3 = (char *)(ulong)bVar1;
                  }
                }
                else {
                  pcVar7 = "0";
                  expr = "Assertion \'_ck_x == _ck_y\' failed";
                  pcVar4 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
                  pcVar5 = "private_ACUtilsTest_ADynArray_reallocCount == 0";
                  pcVar6 = "private_ACUtilsTest_ADynArray_reallocCount";
                  iVar2 = 0x72b;
                  pcVar3 = (char *)private_ACUtilsTest_ADynArray_reallocCount;
                }
                goto LAB_0011a866;
              }
              pcVar3 = "\"";
            }
            expr = 
            "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
            ;
            pcVar4 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
            pcVar5 = "array.buffer == \"01233\"";
            pcVar6 = "array.buffer";
            iVar2 = 0x72a;
          }
        }
      }
      else {
        pcVar7 = "16";
        expr = "Assertion \'_ck_x == _ck_y\' failed";
        pcVar4 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
        pcVar5 = "array.capacity == 16";
        pcVar6 = "array.capacity";
        iVar2 = 0x726;
        pcVar3 = local_18;
      }
    }
    else {
      pcVar7 = "5";
      expr = "Assertion \'_ck_x == _ck_y\' failed";
      pcVar4 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
      pcVar5 = "array.size == 5";
      pcVar6 = "array.size";
      iVar2 = 0x725;
      pcVar3 = local_20;
    }
  }
  else {
    pcVar3 = (char *)(ulong)bVar1;
    pcVar7 = "true";
    expr = "Assertion \'_ck_x == _ck_y\' failed";
    pcVar4 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
    pcVar5 = 
    "private_ACUtils_ADynArray_setRange(&array, 3, 2, &(c), sizeof(*(&array)->buffer)) == true";
    pcVar6 = "private_ACUtils_ADynArray_setRange(&array, 3, 2, &(c), sizeof(*(&array)->buffer))";
    iVar2 = 0x724;
  }
LAB_0011a866:
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,iVar2,expr,pcVar4,pcVar5,pcVar6,pcVar3,pcVar7);
}

Assistant:

END_TEST
START_TEST(test_ADynArray_setRange_success_indexAndRangeBeyondSize)
{
    struct private_ACUtilsTest_ADynArray_CharArray array = {.reallocator = private_ACUtilsTest_ADynArray_realloc, .deallocator = private_ACUtilsTest_ADynArray_free};
    array.size = 3;
    array.growStrategy = private_ACUtilsTest_ADynArray_growStrategy;
    array.capacity = 16;
    private_ACUtilsTest_ADynArray_reallocFail = false;
    array.buffer = (char*) array.reallocator(nullptr, array.capacity);
    memcpy(array.buffer, "012", 3);
    private_ACUtilsTest_ADynArray_reallocFailCounter = 0;
    private_ACUtilsTest_ADynArray_reallocFail = true;
    private_ACUtilsTest_ADynArray_reallocCount = 0;
    char c = '3';
    ACUTILSTEST_ASSERT_UINT_EQ(ADynArray_setRange(&array, 3, 2, c), true);
    ACUTILSTEST_ASSERT_UINT_EQ(array.size, 5);
    ACUTILSTEST_ASSERT_UINT_EQ(array.capacity, 16);
    ACUTILSTEST_ASSERT_PTR_NONNULL(array.buffer);
    ACUTILSTEST_ASSERT_PTR_NONNULL(array.growStrategy);
    array.buffer[array.size] = '\0';
    ACUTILSTEST_ASSERT_STR_EQ(array.buffer, "01233");
    ACUTILSTEST_ASSERT_UINT_EQ(private_ACUtilsTest_ADynArray_reallocCount, 0);
    c = '6';
    ACUTILSTEST_ASSERT_UINT_EQ(ADynArray_setRange(&array, 2342, 3, c), true);
    ACUTILSTEST_ASSERT_UINT_EQ(array.size, 8);
    ACUTILSTEST_ASSERT_UINT_EQ(array.capacity, 16);
    ACUTILSTEST_ASSERT_PTR_NONNULL(array.buffer);
    ACUTILSTEST_ASSERT_PTR_NONNULL(array.growStrategy);
    array.buffer[array.size] = '\0';
    ACUTILSTEST_ASSERT_STR_EQ(array.buffer, "01233666");
    ACUTILSTEST_ASSERT_UINT_EQ(private_ACUtilsTest_ADynArray_reallocCount, 0);
    array.deallocator(array.buffer);
}